

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O0

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/press_tool/main.cpp:268:20),_asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long in_RSI;
  long in_RDI;
  fenced_block b;
  anon_class_8_1_a8adf665_for_handler_ handler;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool_main_cpp:268:20),_asio::io_context::basic_executor_type<std::allocator<void>,_0UL>,_void>
  w;
  ptr p;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool_main_cpp:268:20),_asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *h;
  half_t in_stack_ffffffffffffff9c;
  std_fenced_block *in_stack_ffffffffffffffa0;
  std_fenced_block *in_stack_ffffffffffffffa8;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool_main_cpp:268:20),_asio::io_context::basic_executor_type<std::allocator<void>,_0UL>,_void>
  *this;
  
  this = *(handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool_main_cpp:268:20),_asio::io_context::basic_executor_type<std::allocator<void>,_0UL>,_void>
           **)(in_RSI + 0x18);
  ptr::reset((ptr *)&stack0xffffffffffffffb0);
  if (in_RDI != 0) {
    std_fenced_block::std_fenced_block(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    handler_work<main::$_1,asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::
    complete<main::__1>(this,(anon_class_8_1_a8adf665_for_handler_ *)in_stack_ffffffffffffffa8,
                        (anon_class_8_1_a8adf665_for_handler_ *)in_stack_ffffffffffffffa0);
    std_fenced_block::~std_fenced_block(in_stack_ffffffffffffffa8);
  }
  ptr::~ptr((ptr *)0x11c552);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }